

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

void __thiscall
llvm::DWARFDebugNames::ValueIterator::searchFromStartOfCurrentIndex(ValueIterator *this)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  NameIndex *pNVar4;
  Optional<unsigned_long> OVar5;
  
  pNVar4 = this->CurrentIndex;
  uVar1 = (pNVar4->Section->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
          super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
          super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
          super_SmallVectorBase.Size;
  pvVar2 = (pNVar4->Section->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
           super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
           super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
           super_SmallVectorBase.BeginX;
  do {
    if (pNVar4 == (NameIndex *)((ulong)uVar1 * 0x98 + (long)pvVar2)) {
      setEnd(this);
      return;
    }
    OVar5 = findEntryOffsetInCurrentIndex(this);
    if (((undefined1  [16])OVar5.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this->DataOffset = (uint64_t)OVar5.Storage.field_0;
      bVar3 = getEntryAtCurrentOffset(this);
      if (bVar3) {
        return;
      }
    }
    pNVar4 = this->CurrentIndex + 1;
    this->CurrentIndex = pNVar4;
  } while( true );
}

Assistant:

void DWARFDebugNames::ValueIterator::searchFromStartOfCurrentIndex() {
  for (const NameIndex *End = CurrentIndex->Section.NameIndices.end();
       CurrentIndex != End; ++CurrentIndex) {
    if (findInCurrentIndex())
      return;
  }
  setEnd();
}